

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_role_transition(lws *wsi,lwsi_role role,lwsi_state state,lws_role_ops *ops)

{
  lws_log_cx *cx;
  char *local_28;
  char *name;
  lws_role_ops *ops_local;
  lwsi_state state_local;
  lwsi_role role_local;
  lws *wsi_local;
  
  local_28 = "(unset)";
  wsi->wsistate = role | state;
  if (ops != (lws_role_ops *)0x0) {
    wsi->role_ops = ops;
  }
  if (wsi->role_ops != (lws_role_ops *)0x0) {
    local_28 = wsi->role_ops->name;
  }
  cx = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_role_transition","wsistate 0x%lx, ops %s",
              (ulong)wsi->wsistate,local_28);
  return;
}

Assistant:

void
lws_role_transition(struct lws *wsi, enum lwsi_role role, enum lwsi_state state,
		    const struct lws_role_ops *ops)
{
#if (_LWS_ENABLED_LOGS & LLL_DEBUG) 
	const char *name = "(unset)";
#endif
	wsi->wsistate = (unsigned int)role | (unsigned int)state;
	if (ops)
		wsi->role_ops = ops;
#if (_LWS_ENABLED_LOGS & LLL_DEBUG)
	if (wsi->role_ops)
		name = wsi->role_ops->name;
	lwsl_wsi_debug(wsi, "wsistate 0x%lx, ops %s",
			    (unsigned long)wsi->wsistate, name);
#endif
}